

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O2

XMLCh __thiscall xercesc_4_0::ReaderMgr::peekNextChar(ReaderMgr *this)

{
  bool bVar1;
  XMLCh chRet;
  XMLCh local_a;
  
  bVar1 = XMLReader::peekNextChar(this->fCurReader,&local_a);
  if (!bVar1) {
    bVar1 = popReader(this);
    if (bVar1) {
      XMLReader::peekNextChar(this->fCurReader,&local_a);
    }
    else {
      local_a = L'\0';
    }
  }
  return local_a;
}

Assistant:

XMLCh ReaderMgr::peekNextChar()
{
    XMLCh chRet;
    if (fCurReader->peekNextChar(chRet))
        return chRet;

    //
    //  Didn't get anything back so this reader is hosed. So lets move to
    //  the next reader on the stack. If this fails, it will be because
    //  its the end of the original file, and we just return zero.
    //
    if (!popReader())
        return XMLCh(0);

    // Else peek again and return the character
    fCurReader->peekNextChar(chRet);
    return chRet;
}